

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<std::pair<QByteArray,_QByteArray>_>::moveAppend
          (QGenericArrayOps<std::pair<QByteArray,_QByteArray>_> *this,
          pair<QByteArray,_QByteArray> *b,pair<QByteArray,_QByteArray> *e)

{
  pair<QByteArray,_QByteArray> *this_00;
  ulong in_RDX;
  ulong in_RSI;
  pair<QByteArray,_QByteArray> *in_RDI;
  pair<QByteArray,_QByteArray> *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::begin
                        ((QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)0x178b47);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      std::pair<QByteArray,_QByteArray>::pair(this_00,in_RDI);
      local_10 = local_10 + 0x30;
      (in_RDI->first).d.size = (in_RDI->first).d.size + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }